

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaos.c
# Opt level: O1

void chaos_mode(dw_rom *rom)

{
  uint8_t *puVar1;
  float *pfVar2;
  uint16_t *__base;
  double dVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  ushort *puVar9;
  long lVar10;
  BOOL consistent;
  int iVar11;
  long lVar12;
  dw_enemy *pdVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_2b0;
  double x;
  undefined8 uStack_290;
  
  if ((rom->flags[5] & 0xc) != 0) {
    consistent = rom->flags[6] & 0xffffffc0;
    x = 0.0;
    pdVar13 = rom->enemies;
    lVar12 = 0;
    do {
      dVar3 = mt_rand_double_ranged(1.0,40.0);
      dVar3 = (double)(float)dVar3;
      dVar15 = 4.0;
      x = dVar3;
      dVar17 = pow(dVar3,4.0);
      dVar3 = polyfit(dVar3,&mon_hp_fac);
      (&pdVar13->hp)[lVar12] = (uint8_t)(int)dVar3;
      dVar3 = next_rank(consistent,&x,1.0,dVar15);
      dVar16 = 4.0;
      dVar3 = pow(dVar3,4.0);
      dVar15 = polyfit(x,&mon_str_fac);
      (&pdVar13->str)[lVar12] = (uint8_t)(int)dVar15;
      dVar15 = next_rank(consistent,&x,1.0,dVar16);
      dVar15 = pow(dVar15,4.0);
      dVar16 = polyfit(x,&mon_agi_fac);
      (&pdVar13->agi)[lVar12] = (uint8_t)(int)dVar16;
      dVar16 = mt_rand_double_ranged(1.0,40.0);
      dVar16 = (double)(float)dVar16;
      x = dVar16;
      local_2b0 = pow(dVar16 / 3.0,4.0);
      local_2b0 = local_2b0 + dVar15 + dVar3 + dVar17;
      dVar3 = polyfit(dVar16,&mon_sr_fac);
      (&pdVar13->s_ss_resist)[lVar12] = (char)(int)dVar3 << 4;
      if ((&pdVar13->pattern)[lVar12] != '\0') {
        dVar3 = mt_rand_double_ranged(1.0,40.0);
        dVar3 = (double)(float)dVar3;
        x = dVar3;
        dVar17 = pow(dVar3 / 3.0,4.0);
        local_2b0 = local_2b0 + dVar17;
        dVar3 = polyfit(dVar3,&mon_ssr_fac);
        (&pdVar13->s_ss_resist)[lVar12] = (&pdVar13->s_ss_resist)[lVar12] | (byte)(int)dVar3;
      }
      dVar3 = mt_rand_double_ranged(1.0,40.0);
      dVar3 = (double)(float)dVar3;
      x = dVar3;
      dVar17 = pow(dVar3 / 3.0,4.0);
      dVar3 = polyfit(dVar3,&mon_hr_fac);
      (&pdVar13->hr_dodge)[lVar12] = (char)(int)dVar3 << 4;
      dVar3 = mt_rand_double_ranged(1.0,40.0);
      x = (double)(float)dVar3;
      dVar3 = polyfit(x,&mon_dodge_fac);
      (&pdVar13->hr_dodge)[lVar12] = (&pdVar13->hr_dodge)[lVar12] | (byte)(int)dVar3;
      if ((&pdVar13->pattern)[lVar12] == '\0') {
        (&pdVar13->s_ss_resist)[lVar12] = (&pdVar13->s_ss_resist)[lVar12] | 0xf;
      }
      local_2b0 = local_2b0 + dVar17;
      if (local_2b0 < 0.0) {
        local_2b0 = sqrt(local_2b0);
      }
      else {
        local_2b0 = SQRT(local_2b0);
      }
      if (local_2b0 < 0.0) {
        local_2b0 = sqrt(local_2b0);
      }
      else {
        local_2b0 = SQRT(local_2b0);
      }
      *(float *)((long)&pdVar13->rank + lVar12) = (float)(local_2b0 * 0.75);
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x260);
    dVar17 = 40.0;
    dVar3 = mt_rand_double_ranged(28.0,40.0);
    x = (double)(float)dVar3;
    dVar3 = polyfit(x,&mon_hp_fac);
    pdVar13[0x26].hp = (uint8_t)(int)dVar3;
    next_rank(consistent,&x,28.0,dVar17);
    dVar3 = polyfit(x,&mon_str_fac);
    pdVar13[0x26].str = (uint8_t)(int)dVar3;
    next_rank(consistent,&x,28.0,dVar17);
    dVar3 = polyfit(x,&mon_agi_fac);
    pdVar13[0x26].agi = (uint8_t)(int)dVar3;
    lVar12 = 0;
    uVar7 = mt_rand(0,0xff);
    pdVar13[0x26].pattern = (uint8_t)uVar7;
    pdVar13[0x26].s_ss_resist = pdVar13[0x26].s_ss_resist & 0xf0;
    dVar3 = mt_rand_double_ranged(38.0,40.0);
    x = (double)(float)dVar3;
    dVar3 = polyfit(x,&mon_ssr_fac);
    pdVar13[0x26].s_ss_resist = pdVar13[0x26].s_ss_resist | (byte)(int)dVar3;
    pdVar13[0x26].rank = 39.9;
    uVar7 = mt_rand(0,0xff);
    bVar5 = (byte)uVar7 & 0xb0 | pdVar13[0x27].pattern;
    bVar6 = bVar5 & 0xcf;
    if ((~bVar5 & 0x30) != 0) {
      bVar6 = bVar5;
    }
    pdVar13[0x27].pattern = bVar6;
    pdVar13[0x27].s_ss_resist = pdVar13[0x27].s_ss_resist & 0xf0;
    dVar3 = mt_rand_double_ranged(38.0,40.0);
    x = (double)(float)dVar3;
    dVar3 = polyfit(x,&mon_ssr_fac);
    pdVar13[0x27].s_ss_resist = pdVar13[0x27].s_ss_resist | (byte)(int)dVar3;
    uVar7 = mt_rand(100,0xe6);
    pdVar13[0x27].hp = (uint8_t)uVar7;
    pdVar13[0x27].rank = 40.0;
    do {
      rom->repel_table[lVar12] = pdVar13->str;
      lVar12 = lVar12 + 1;
      pdVar13 = pdVar13 + 1;
    } while (lVar12 != 0x26);
    pdVar13 = rom->enemies;
    lVar12 = 0;
    lVar10 = 0;
    do {
      *(short *)((long)&pdVar13->index + lVar12) = (short)lVar10;
      puVar1 = &pdVar13->str + lVar12;
      uVar4 = *(undefined8 *)(puVar1 + 8);
      *(undefined8 *)((long)&x + lVar12) = *(undefined8 *)puVar1;
      *(undefined8 *)((long)&uStack_290 + lVar12) = uVar4;
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar10 != 0x26);
    qsort(&x,0x26,0x10,compare_enemies);
    lVar10 = 0;
    lVar12 = 0;
    do {
      uVar7 = 0xe;
      if (lVar12 == 0) {
        uVar7 = 7;
      }
      lVar14 = 0;
      pdVar13 = (dw_enemy *)0x0;
      do {
        uVar8 = mt_rand(0,uVar7);
        puVar9 = (ushort *)((long)&uStack_290 + (long)(int)uVar8 * 0x10 + 6);
        rom->zones[lVar14 + lVar10] = (uint8_t)*puVar9;
        if ((pdVar13 == (dw_enemy *)0x0) ||
           (pfVar2 = &rom->enemies[*puVar9].rank,
           *pfVar2 <= pdVar13->rank && pdVar13->rank != *pfVar2)) {
          pdVar13 = rom->enemies + *puVar9;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 5);
      bVar6 = pdVar13->hp;
      if (4 < pdVar13->hp) {
        bVar6 = 5;
      }
      pdVar13->hp = bVar6;
      bVar6 = pdVar13->str;
      if (9 < pdVar13->str) {
        bVar6 = 10;
      }
      pdVar13->str = bVar6;
      pdVar13->pattern = '\0';
      dVar3 = mt_rand_double_ranged(1.0,25.0);
      dVar3 = polyfit(dVar3,&mon_xp_fac);
      pdVar13->xp = (ushort)(int)dVar3 & 0xff;
      pdVar13->rank = 1.0;
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 5;
    } while (lVar12 != 3);
    lVar12 = 0x10;
    lVar10 = 0x50;
    do {
      lVar14 = -5;
      do {
        uVar7 = mt_rand(0x1b,0x24);
        rom->zones[lVar14 + 5 + lVar10] = *(uint8_t *)((long)&uStack_290 + uVar7 * 0x10 + 6);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 5;
    } while (lVar12 != 0x13);
    lVar12 = -3;
    do {
      uVar7 = mt_rand(0x21,0x25);
      rom->spike_table->monster[lVar12 + 3] = *(uint8_t *)((long)&uStack_290 + uVar7 * 0x10 + 6);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
    lVar12 = -5;
    do {
      uVar7 = mt_rand(0x15,0x20);
      rom->spike_table[1].map[lVar12] = *(uint8_t *)((long)&uStack_290 + uVar7 * 0x10 + 6);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
  }
  if (((rom->flags[5] & 0xc) != 0) || ((rom->flags[4] & 3) != 0)) {
    puts("Enabling alternate running algorithm...");
    vpatch(rom,0xee94,0x35,0xa5,0x45,0xc9,0x14,0x90,7,0xa5,0x95,0x29,0x7f,0x4c,199,0xee,0xc9,6,0x90,
           5,0xa5,0x95,0x4c,199,0xee,0xc9,2,0x90,0x12,0xa5,0x95,0x29,0x3f,0x85,0x3e,0x20,0x5b,0xc5,
           0xa5,0x95,0x29,0x1f,0x65,0x3e,0x4c,199,0xee,0x20,0x5b,0xc5,0xa5,0x95,0x29,0x3f,0x85,0x3c)
    ;
  }
  if ((rom->flags[5] & 3) != 0) {
    pdVar13 = rom->enemies;
    iVar11 = 1;
    lVar12 = 10;
    do {
      if ((rom->flags[5] & 0xc) == 0) {
        x = (double)iVar11;
      }
      else {
        x = (double)*(float *)(&pdVar13->str + lVar12);
      }
      if ((*(float *)(&pdVar13->str + lVar12) != 1.0) || (NAN(*(float *)(&pdVar13->str + lVar12))))
      {
        next_rank(rom->flags[6] & 0xffffffc0,&x,1.0,1.0);
        dVar3 = polyfit(x,&mon_xp_fac);
        *(short *)((long)pdVar13 + lVar12 + -4) = (short)(int)dVar3;
      }
      next_rank(rom->flags[6] & 0xffffffc0,&x,1.0,1.0);
      dVar3 = polyfit(x,&mon_gold_fac);
      *(short *)((long)pdVar13 + lVar12 + -2) = (short)(int)dVar3;
      iVar11 = iVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x26a);
  }
  if ((rom->flags[1] & 3) != 0) {
    lVar12 = 1;
    do {
      dVar3 = mt_rand_double_ranged(1.0,30.0);
      dVar3 = polyfit(dVar3,&hero_xp_fac);
      __base = rom->xp_reqs;
      __base[lVar12] = (uint16_t)(int)dVar3;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x1e);
    if ((rom->flags[0xd] & 0x10) == 0) {
      if ((rom->flags[0xd] & 0x20) != 0) {
        lVar12 = 1;
        do {
          __base[lVar12] = __base[lVar12] >> 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x1e);
      }
    }
    else {
      lVar12 = 1;
      do {
        __base[lVar12] = (uint16_t)(int)((double)__base[lVar12] * 3.0 * 0.25);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x1e);
    }
    qsort(__base,0x1e,2,compare_16);
  }
  if ((rom->flags[1] & 0xc) != 0) {
    lVar12 = 0;
    do {
      dVar3 = mt_rand_double_ranged(1.0,15.0);
      dVar3 = polyfit(dVar3,&wpn_price_fac);
      rom->weapon_prices[lVar12] = (uint16_t)(int)dVar3;
      rom->weapon_price_display[lVar12] = (uint16_t)(int)dVar3;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x11);
  }
  return;
}

Assistant:

void chaos_mode(dw_rom *rom)
{
    if (RANDOM_ENEMY_STATS(rom)) {
        chaos_enemy_stats(rom);
        chaos_zones(rom);
    }

    chaos_running(rom);
    chaos_enemy_drops(rom);
    chaos_xp(rom);
    chaos_weapon_prices(rom);
}